

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SccLiveness.cpp
# Opt level: O2

void __thiscall SCCLiveness::EndOpHelper(SCCLiveness *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  Type *this_00;
  
  if (this->lastOpHelperLabel == (LabelInstr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/SccLiveness.cpp"
                       ,0x164,"(this->lastOpHelperLabel != nullptr)",
                       "this->lastOpHelperLabel != nullptr");
    if (!bVar2) goto LAB_005b0bf0;
    *puVar4 = 0;
  }
  this_00 = SList<OpHelperBlock,Memory::ArenaAllocator,RealCount>::
            PrependNode<Memory::JitArenaAllocator*>
                      ((SList<OpHelperBlock,Memory::ArenaAllocator,RealCount> *)
                       &this->opHelperBlockList,this->tempAlloc);
  if (this_00 == (Type *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/SccLiveness.cpp"
                       ,0x167,"(opHelperBlock != nullptr)","opHelperBlock != nullptr");
    if (!bVar2) {
LAB_005b0bf0:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  this_00->opHelperLabel = this->lastOpHelperLabel;
  this_00->opHelperEndInstr = instr;
  uVar3 = OpHelperBlock::Length(this_00);
  this->totalOpHelperFullVisitedLength = this->totalOpHelperFullVisitedLength + uVar3;
  this->lastOpHelperLabel = (LabelInstr *)0x0;
  return;
}

Assistant:

void
SCCLiveness::EndOpHelper(IR::Instr * instr)
{
    Assert(this->lastOpHelperLabel != nullptr);

    OpHelperBlock * opHelperBlock = this->opHelperBlockList.PrependNode(this->tempAlloc);
    Assert(opHelperBlock != nullptr);
    opHelperBlock->opHelperLabel = this->lastOpHelperLabel;
    opHelperBlock->opHelperEndInstr = instr;

    this->totalOpHelperFullVisitedLength += opHelperBlock->Length();
    this->lastOpHelperLabel = nullptr;
}